

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

bool __thiscall toml::internal::Parser::parseValue(Parser *this,Value *v)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_40 [8];
  anon_union_8_8_51f126cb_for_Value_2 local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  switch((this->token_).type_) {
  case ERROR_TOKEN:
    addError(this,&(this->token_).str_value_);
    break;
  default:
    local_40 = (undefined1  [8])&local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"unexpected token","");
    addError(this,(string *)local_40);
    if (local_40 != (undefined1  [8])&local_30) {
      operator_delete((void *)local_40,local_30._M_allocated_capacity + 1);
    }
    break;
  case STRING:
  case MULTILINE_STRING:
    Value::Value((Value *)local_40,&(this->token_).str_value_);
    if ((Value *)local_40 == v) goto LAB_00135af3;
    Value::~Value(v);
    v->type_ = local_40._0_4_;
    switch((ulong)local_40 & 0xffffffff) {
    case 0:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
switchD_001359cc_caseD_0:
      (v->field_1).null_ = (void *)local_38;
      break;
    case 1:
switchD_001359cc_caseD_1:
      (v->field_1).bool_ = local_38.bool_;
      break;
    case 3:
switchD_001359cc_caseD_3:
      (v->field_1).null_ = (void *)local_38;
      break;
    default:
switchD_001359cc_default:
      v->type_ = NULL_TYPE;
      (v->field_1).null_ = (void *)0x0;
    }
    local_40 = (undefined1  [8])((ulong)(uint)local_40._4_4_ << 0x20);
    local_38.null_ = (void *)0x0;
LAB_00135af3:
    Value::~Value((Value *)local_40);
    nextValue(this);
    return true;
  case BOOL:
    local_40._0_4_ = 1;
    local_38.bool_ = (this->token_).int_value_ != 0;
    if ((Value *)local_40 == v) goto LAB_00135af3;
    Value::~Value(v);
    v->type_ = local_40._0_4_;
    switch((ulong)local_40 & 0xffffffff) {
    case 0:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
      goto switchD_001359cc_caseD_0;
    case 1:
      goto switchD_001359cc_caseD_1;
    case 3:
      goto switchD_001359cc_caseD_3;
    default:
      goto switchD_001359cc_default;
    }
  case INT:
    local_38 = (anon_union_8_8_51f126cb_for_Value_2)(this->token_).int_value_;
    local_40._0_4_ = 2;
    if ((Value *)local_40 == v) goto LAB_00135af3;
    Value::~Value(v);
    v->type_ = local_40._0_4_;
    switch((ulong)local_40 & 0xffffffff) {
    case 0:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
      goto switchD_001359cc_caseD_0;
    case 1:
      goto switchD_001359cc_caseD_1;
    case 3:
      goto switchD_001359cc_caseD_3;
    default:
      goto switchD_001359cc_default;
    }
  case DOUBLE:
    local_38 = (anon_union_8_8_51f126cb_for_Value_2)(this->token_).double_value_;
    local_40._0_4_ = 3;
    if ((Value *)local_40 == v) goto LAB_00135af3;
    Value::~Value(v);
    v->type_ = local_40._0_4_;
    switch((ulong)local_40 & 0xffffffff) {
    case 0:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
      goto switchD_001359cc_caseD_0;
    case 1:
      goto switchD_001359cc_caseD_1;
    case 3:
      goto switchD_001359cc_caseD_3;
    default:
      goto switchD_001359cc_default;
    }
  case TIME:
    pcVar1 = (pointer)(this->token_).time_value_.__d.__r;
    local_40._0_4_ = 5;
    local_38.null_ = operator_new(8);
    ((local_38.string_)->_M_dataplus)._M_p = pcVar1;
    if ((Value *)local_40 == v) goto LAB_00135af3;
    Value::~Value(v);
    v->type_ = local_40._0_4_;
    switch((ulong)local_40 & 0xffffffff) {
    case 0:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
      goto switchD_001359cc_caseD_0;
    case 1:
      goto switchD_001359cc_caseD_1;
    case 3:
      goto switchD_001359cc_caseD_3;
    default:
      goto switchD_001359cc_default;
    }
  case LBRACKET:
    bVar2 = parseArray(this,v);
    return bVar2;
  case LBRACE:
    bVar2 = parseInlineTable(this,v);
    return bVar2;
  }
  return false;
}

Assistant:

inline bool Parser::parseValue(Value* v)
{
    switch (token().type()) {
    case TokenType::STRING:
    case TokenType::MULTILINE_STRING:
        *v = token().strValue();
        nextValue();
        return true;
    case TokenType::LBRACKET:
        return parseArray(v);
    case TokenType::LBRACE:
        return parseInlineTable(v);
    case TokenType::BOOL:
        *v = token().boolValue();
        nextValue();
        return true;
    case TokenType::INT:
        *v = token().intValue();
        nextValue();
        return true;
    case TokenType::DOUBLE:
        *v = token().doubleValue();
        nextValue();
        return true;
    case TokenType::TIME:
        *v = token().timeValue();
        nextValue();
        return true;
    case TokenType::ERROR_TOKEN:
        addError(token().strValue());
        return false;
    default:
        addError("unexpected token");
        return false;
    }
}